

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyAsciiToHex(sxi32 c)

{
  undefined4 local_c;
  sxi32 c_local;
  
  if ((c < 0x61) || (0x66 < c)) {
    if ((c < 0x30) || (0x39 < c)) {
      if ((c < 0x41) || (0x46 < c)) {
        local_c = 0;
      }
      else {
        local_c = c + -0x37;
      }
    }
    else {
      local_c = c + -0x30;
    }
  }
  else {
    local_c = c + -0x57;
  }
  return local_c;
}

Assistant:

static sxi32 SyAsciiToHex(sxi32 c)
{
	if( c >= 'a' && c <= 'f' ){
		c += 10 - 'a';
		return c;
	}
	if( c >= '0' && c <= '9' ){
		c -= '0';
		return c;
	}
	if( c >= 'A' && c <= 'F') {
		c += 10 - 'A';
		return c;
	}		
	return 0; 
}